

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

Rtm_Man_t * Rtm_ManFromAig(Aig_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  void *pvVar2;
  ulong uVar3;
  Rtm_Man_t *pRtm;
  Rtm_Obj_t *pRVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                  ,0x2a8,"Rtm_Man_t *Rtm_ManFromAig(Aig_Man_t *)");
  }
  if (p->nObjs[4] != 0) {
    __assert_fail("Aig_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                  ,0x2a9,"Rtm_Man_t *Rtm_ManFromAig(Aig_Man_t *)");
  }
  pRtm = Rtm_ManAlloc(p);
  pAVar1 = p->pConst1;
  pRVar4 = Rtm_ObjAlloc(pRtm,0,*(uint *)&pAVar1->field_0x18 >> 6);
  (pAVar1->field_5).pData = pRVar4;
  if (p->nRegs < p->nObjs[2]) {
    lVar11 = 0;
    do {
      if (p->vCis->nSize <= lVar11) goto LAB_006c53a5;
      pvVar2 = p->vCis->pArray[lVar11];
      pRVar4 = Rtm_ObjAlloc(pRtm,0,*(uint *)((long)pvVar2 + 0x18) >> 6);
      *(Rtm_Obj_t **)((long)pvVar2 + 0x28) = pRVar4;
      pVVar6 = pRtm->vPis;
      uVar8 = pVVar6->nCap;
      if (pVVar6->nSize == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
          }
          pVVar6->pArray = ppvVar5;
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar8 * 2;
          if (iVar7 <= (int)uVar8) goto LAB_006c5023;
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar8 << 4);
          }
          pVVar6->pArray = ppvVar5;
        }
        pVVar6->nCap = iVar7;
      }
LAB_006c5023:
      iVar7 = pVVar6->nSize;
      pVVar6->nSize = iVar7 + 1;
      pVVar6->pArray[iVar7] = pRVar4;
      lVar11 = lVar11 + 1;
    } while (lVar11 < (long)p->nObjs[2] - (long)p->nRegs);
  }
  iVar7 = p->nRegs;
  if (iVar7 < p->nObjs[3]) {
    lVar11 = 0;
    do {
      if (p->vCos->nSize <= lVar11) goto LAB_006c53a5;
      pvVar2 = p->vCos->pArray[lVar11];
      pRVar4 = Rtm_ObjAlloc(pRtm,1,0);
      *(Rtm_Obj_t **)((long)pvVar2 + 0x28) = pRVar4;
      pVVar6 = pRtm->vPos;
      uVar8 = pVVar6->nCap;
      if (pVVar6->nSize == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
          }
          pVVar6->pArray = ppvVar5;
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar8 * 2;
          if (iVar7 <= (int)uVar8) goto LAB_006c50fe;
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar8 << 4);
          }
          pVVar6->pArray = ppvVar5;
        }
        pVVar6->nCap = iVar7;
      }
LAB_006c50fe:
      iVar7 = pVVar6->nSize;
      pVVar6->nSize = iVar7 + 1;
      pVVar6->pArray[iVar7] = pRVar4;
      lVar11 = lVar11 + 1;
      iVar7 = p->nRegs;
    } while (lVar11 < (long)p->nObjs[3] - (long)iVar7);
  }
  uVar8 = p->nObjs[2] - iVar7;
  pVVar6 = p->vCis;
  if ((int)uVar8 < pVVar6->nSize) {
    uVar13 = (ulong)uVar8;
    do {
      if ((int)uVar8 < 0) goto LAB_006c53a5;
      pvVar2 = pVVar6->pArray[uVar13];
      pRVar4 = Rtm_ObjAlloc(pRtm,1,*(uint *)((long)pvVar2 + 0x18) >> 6);
      *(Rtm_Obj_t **)((long)pvVar2 + 0x28) = pRVar4;
      uVar13 = uVar13 + 1;
      pVVar6 = p->vCis;
    } while ((int)uVar13 < pVVar6->nSize);
  }
  uVar8 = p->nObjs[3] - p->nRegs;
  pVVar6 = p->vCos;
  if ((int)uVar8 < pVVar6->nSize) {
    uVar13 = (ulong)uVar8;
    do {
      if ((int)uVar8 < 0) goto LAB_006c53a5;
      pvVar2 = pVVar6->pArray[uVar13];
      pRVar4 = Rtm_ObjAlloc(pRtm,1,1);
      *(Rtm_Obj_t **)((long)pvVar2 + 0x28) = pRVar4;
      uVar13 = uVar13 + 1;
      pVVar6 = p->vCos;
    } while ((int)uVar13 < pVVar6->nSize);
  }
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar6->pArray[lVar11];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        pRVar4 = Rtm_ObjAlloc(pRtm,2,*(uint *)((long)pvVar2 + 0x18) >> 6);
        *(Rtm_Obj_t **)((long)pvVar2 + 0x28) = pRVar4;
      }
      lVar11 = lVar11 + 1;
      pVVar6 = p->vObjs;
    } while (lVar11 < pVVar6->nSize);
  }
  uVar8 = p->nObjs[3] - p->nRegs;
  uVar13 = (ulong)uVar8;
  if (uVar8 != 0 && p->nRegs <= p->nObjs[3]) {
    lVar11 = 0;
    do {
      if (p->vCos->nSize <= lVar11) goto LAB_006c53a5;
      pvVar2 = p->vCos->pArray[lVar11];
      uVar13 = *(ulong *)((long)pvVar2 + 8);
      Rtm_ObjAddFanin(*(Rtm_Obj_t **)((long)pvVar2 + 0x28),
                      *(Rtm_Obj_t **)((uVar13 & 0xfffffffffffffffe) + 0x28),(uint)uVar13 & 1);
      lVar11 = lVar11 + 1;
      uVar13 = (long)p->nObjs[3] - (long)p->nRegs;
    } while (lVar11 < (long)uVar13);
  }
  pVVar6 = p->vCos;
  if ((int)uVar13 < pVVar6->nSize) {
    uVar12 = uVar13 & 0xffffffff;
    do {
      if ((int)uVar13 < 0) goto LAB_006c53a5;
      uVar3 = *(ulong *)((long)pVVar6->pArray[uVar12] + 8);
      Rtm_ObjAddFanin(*(Rtm_Obj_t **)((long)pVVar6->pArray[uVar12] + 0x28),
                      *(Rtm_Obj_t **)((uVar3 & 0xfffffffffffffffe) + 0x28),(uint)uVar3 & 1);
      uVar12 = uVar12 + 1;
      pVVar6 = p->vCos;
    } while ((int)uVar12 < pVVar6->nSize);
  }
  iVar7 = p->nRegs;
  if (0 < iVar7) {
    iVar9 = 0;
    do {
      uVar8 = (p->nObjs[3] - iVar7) + iVar9;
      if (((((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar8)) ||
          (uVar10 = (p->nObjs[2] - iVar7) + iVar9, (int)uVar10 < 0)) ||
         (p->vCis->nSize <= (int)uVar10)) {
LAB_006c53a5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Rtm_ObjAddFanin(*(Rtm_Obj_t **)((long)p->vCis->pArray[uVar10] + 0x28),
                      *(Rtm_Obj_t **)((long)p->vCos->pArray[uVar8] + 0x28),0);
      iVar9 = iVar9 + 1;
      iVar7 = p->nRegs;
    } while (iVar9 < iVar7);
  }
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar6->pArray[lVar11];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        Rtm_ObjAddFanin(*(Rtm_Obj_t **)((long)pvVar2 + 0x28),
                        *(Rtm_Obj_t **)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x28),
                        (uint)*(ulong *)((long)pvVar2 + 8) & 1);
        Rtm_ObjAddFanin(*(Rtm_Obj_t **)((long)pvVar2 + 0x28),
                        *(Rtm_Obj_t **)
                         ((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x28),
                        (uint)*(ulong *)((long)pvVar2 + 0x10) & 1);
      }
      lVar11 = lVar11 + 1;
      pVVar6 = p->vObjs;
    } while (lVar11 < pVVar6->nSize);
  }
  return pRtm;
}

Assistant:

Rtm_Man_t * Rtm_ManFromAig( Aig_Man_t * p )
{
    Rtm_Man_t * pRtm;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    assert( Aig_ManBufNum(p) == 0 );
    // allocate the manager
    pRtm = Rtm_ManAlloc( p );
    // allocate objects
    pObj = Aig_ManConst1(p);
    pObj->pData = Rtm_ObjAlloc( pRtm, 0, pObj->nRefs );
    Aig_ManForEachPiSeq( p, pObj, i )
    {
        pObj->pData = Rtm_ObjAlloc( pRtm, 0, pObj->nRefs );
        Vec_PtrPush( pRtm->vPis, pObj->pData );
    }
    Aig_ManForEachPoSeq( p, pObj, i )
    {
        pObj->pData = Rtm_ObjAlloc( pRtm, 1, 0 );
        Vec_PtrPush( pRtm->vPos, pObj->pData );
    }
    Aig_ManForEachLoSeq( p, pObj, i )
        pObj->pData = Rtm_ObjAlloc( pRtm, 1, pObj->nRefs );
    Aig_ManForEachLiSeq( p, pObj, i )
        pObj->pData = Rtm_ObjAlloc( pRtm, 1, 1 );
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Rtm_ObjAlloc( pRtm, 2, pObj->nRefs );
    // connect objects
    Aig_ManForEachPoSeq( p, pObj, i )
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObj->pData, (Rtm_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
    Aig_ManForEachLiSeq( p, pObj, i )
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObj->pData, (Rtm_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObjLo->pData, (Rtm_Obj_t *)pObjLi->pData, 0 );
    Aig_ManForEachNode( p, pObj, i )
    {
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObj->pData, (Rtm_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObj->pData, (Rtm_Obj_t *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
    }
    return pRtm;
}